

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-target.inc.c
# Opt level: O1

void tcg_out_mb(TCGContext_conflict9 *s,TCGArg a0)

{
  tcg_insn_unit *ptVar1;
  
  if ((a0 & 2) != 0) {
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = 0xf0;
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = 0x83;
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = '\f';
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = '$';
    ptVar1 = s->code_ptr;
    s->code_ptr = ptVar1 + 1;
    *ptVar1 = '\0';
  }
  return;
}

Assistant:

static inline void tcg_out_mb(TCGContext *s, TCGArg a0)
{
    /* Given the strength of x86 memory ordering, we only need care for
       store-load ordering.  Experimentally, "lock orl $0,0(%esp)" is
       faster than "mfence", so don't bother with the sse insn.  */
    if (a0 & TCG_MO_ST_LD) {
        tcg_out8(s, 0xf0);
        tcg_out_modrm_offset(s, OPC_ARITH_EvIb, ARITH_OR, TCG_REG_ESP, 0);
        tcg_out8(s, 0);
    }
}